

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O3

fasttext_predictions_t *
cft_fasttext_predict(fasttext_t *handle,char *text,int32_t k,float threshold,char **errptr)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  fasttext_predictions_t *pfVar4;
  fasttext_prediction_t *pfVar5;
  char *pcVar6;
  size_t sVar7;
  char **ppcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  stringstream ioss;
  allocator local_1fd;
  float local_1fc;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f8;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_1f8.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1fc = threshold;
  std::__cxx11::string::string((string *)local_1d8,text,&local_1fd);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_1d8,_S_out|_S_in);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  fasttext::FastText::predictLine((FastText *)handle,(istream *)local_1b8,&local_1f8,k,local_1fc);
  ppVar2 = local_1f8.
           super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = local_1f8.
           super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)local_1f8.
                super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_1f8.
                super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  sVar7 = lVar3 * -0x3333333333333333;
  pfVar4 = (fasttext_predictions_t *)malloc(0x10);
  pfVar4->length = sVar7;
  pfVar5 = (fasttext_prediction_t *)malloc(lVar3 * -0x3333333333333330);
  if (ppVar2 != ppVar1) {
    lVar3 = sVar7 + (sVar7 == 0);
    ppcVar8 = &pfVar5->label;
    do {
      pbVar9 = &ppVar1->second;
      pcVar6 = strdup((pbVar9->_M_dataplus)._M_p);
      *ppcVar8 = pcVar6;
      ((fasttext_prediction_t *)(ppcVar8 + -1))->prob = *(float *)((long)(pbVar9 + -1) + 0x18);
      ppcVar8 = ppcVar8 + 2;
      ppVar1 = (pointer)(pbVar9 + 1);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  pfVar4->predictions = pfVar5;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1f8);
  return pfVar4;
}

Assistant:

fasttext_predictions_t* cft_fasttext_predict(fasttext_t* handle, const char* text, int32_t k, float threshold, char** errptr) {
    std::vector<std::pair<fasttext::real, std::string>> predictions;
    std::stringstream ioss(text);
    try {
        ((FastText*)handle)->predictLine(ioss, predictions, k, threshold);
    } catch (const std::invalid_argument& e) {
        save_error(errptr, e);
        return nullptr;
    }
    size_t len = predictions.size();
    fasttext_predictions_t* ret = static_cast<fasttext_predictions_t*>(malloc(sizeof(fasttext_predictions_t)));
    ret->length = len;
    fasttext_prediction_t* c_preds = static_cast<fasttext_prediction_t*>(malloc(sizeof(fasttext_prediction_t) * len));
    for (size_t i = 0; i < len; i++) {
        c_preds[i].label = strdup(predictions[i].second.c_str());
        c_preds[i].prob = predictions[i].first;
    }
    ret->predictions = c_preds;
    return ret;
}